

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int __thiscall
CVmObjString::add_val(CVmObjString *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *val)

{
  vm_val_t selfval;
  vm_val_t local_10;
  
  local_10.typ = VM_OBJ;
  local_10.val.obj = self;
  add_to_str(result,&local_10,val);
  return 1;
}

Assistant:

int CVmObjString::add_val(VMG_ vm_val_t *result,
                          vm_obj_id_t self, const vm_val_t *val)
{
    /* set up a 'self' value holder */
    vm_val_t selfval;
    selfval.set_obj(self);

    /* 
     *   Use the generic string adder, using my extension as the constant
     *   string.  We store our extension in the general string format
     *   required by the static adder. 
     */
    add_to_str(vmg_ result, &selfval, val);

    /* handled */
    return TRUE;
}